

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeTargetDepends.cxx
# Opt level: O1

bool __thiscall
cmComputeTargetDepends::ComputeFinalDepends
          (cmComputeTargetDepends *this,cmComputeComponentGraph *ccg)

{
  Graph *this_00;
  pointer *ppcVar1;
  vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *this_01;
  vector<int,_std::allocator<int>_> *this_02;
  int iVar2;
  pointer pcVar3;
  pointer pcVar4;
  iterator __position;
  cmGraphEdge cVar5;
  bool bVar6;
  uint uVar7;
  pointer piVar8;
  ulong uVar9;
  pointer pcVar10;
  bool bVar11;
  int head;
  set<int,_std::less<int>,_std::allocator<int>_> emitted;
  set<int,_std::less<int>,_std::allocator<int>_> visited;
  int local_bc;
  cmComputeTargetDepends *local_b8;
  cmComputeComponentGraph *local_b0;
  undefined1 local_a8 [8];
  _Rb_tree_color local_a0 [2];
  _Base_ptr local_98;
  _Base_ptr local_90;
  _Base_ptr local_88;
  size_t local_80;
  ulong local_78;
  vector<int,_std::allocator<int>_> *local_70;
  vector<int,_std::allocator<int>_> *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  this_00 = &this->FinalGraph;
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&this_00->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,0);
  std::vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>::resize
            (&this_00->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>,
             ((long)(this->InitialGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->InitialGraph).
                    super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                    super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  this_02 = &this->ComponentHead;
  std::vector<int,_std::allocator<int>_>::resize
            (this_02,((long)(ccg->Components).
                            super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(ccg->Components).
                            super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  local_70 = &this->ComponentTail;
  local_b8 = this;
  std::vector<int,_std::allocator<int>_>::resize
            (local_70,((long)(ccg->Components).
                             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)(ccg->Components).
                             super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  uVar7 = (int)((long)(ccg->Components).
                      super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(ccg->Components).
                      super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x55555555;
  bVar11 = (int)uVar7 < 1;
  local_b0 = ccg;
  if (0 < (int)uVar7) {
    local_68 = &ccg->TarjanComponents;
    local_78 = (ulong)(uVar7 & 0x7fffffff);
    uVar9 = 0;
    do {
      local_bc = -1;
      local_a0[0] = _S_red;
      local_98 = (_Base_ptr)0x0;
      local_90 = (_Base_ptr)(local_a8 + 8);
      local_80 = 0;
      pcVar3 = (local_b0->Components).
               super__Vector_base<cmGraphNodeList,_std::allocator<cmGraphNodeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = *(pointer *)
                ((long)&pcVar3[uVar9].super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl + 8);
      local_88 = local_90;
      if (piVar8 != *(pointer *)
                     &pcVar3[uVar9].super_vector<int,_std::allocator<int>_>.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl) {
        do {
          local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_60._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_60._M_impl.super__Rb_tree_header._M_header;
          local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_60._M_impl.super__Rb_tree_header._M_header._M_right =
               local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          bVar6 = IntraComponent(local_b8,local_68,(int)uVar9,piVar8[-1],&local_bc,
                                 (set<int,_std::less<int>,_std::allocator<int>_> *)local_a8,
                                 (set<int,_std::less<int>,_std::allocator<int>_> *)&local_60);
          if (bVar6) {
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree(&local_60);
          }
          else {
            ComplainAboutBadComponent(local_b8,local_b0,(int)uVar9,true);
            std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            ~_Rb_tree(&local_60);
            if (!bVar6) {
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                         *)local_a8);
              return bVar11;
            }
          }
          piVar8 = piVar8 + -1;
        } while (piVar8 != *(pointer *)
                            &pcVar3[uVar9].super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl);
      }
      (this_02->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[uVar9] = local_bc;
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 local_a8);
      uVar9 = uVar9 + 1;
      bVar11 = local_78 <= uVar9;
    } while (uVar9 != local_78);
  }
  uVar7 = (int)((long)(local_b0->ComponentGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(local_b0->ComponentGraph).
                      super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
                      super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x55555555;
  if (0 < (int)uVar7) {
    local_b8 = (cmComputeTargetDepends *)(ulong)(uVar7 & 0x7fffffff);
    uVar9 = 0;
    do {
      pcVar4 = (local_b0->ComponentGraph).
               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar10 = *(pointer *)
                 &pcVar4[uVar9].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                  super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
      if (pcVar10 !=
          *(pointer *)
           ((long)&pcVar4[uVar9].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                   super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8)) {
        iVar2 = (local_70->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar9];
        do {
          local_a8._0_4_ =
               (this_02->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[pcVar10->Dest];
          this_01 = &(this_00->super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>).
                     super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
                     super__Vector_impl_data._M_start[iVar2].
                     super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>;
          local_a8[4] = pcVar10->Strong;
          __position._M_current =
               (this_01->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (this_01->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::_M_realloc_insert<cmGraphEdge>
                      (this_01,__position,(cmGraphEdge *)local_a8);
          }
          else {
            cVar5._4_4_ = local_a8._4_4_;
            cVar5.Dest = local_a8._0_4_;
            *__position._M_current = cVar5;
            ppcVar1 = &(this_01->super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>).
                       _M_impl.super__Vector_impl_data._M_finish;
            *ppcVar1 = *ppcVar1 + 1;
          }
          pcVar10 = pcVar10 + 1;
        } while (pcVar10 !=
                 *(pointer *)
                  ((long)&pcVar4[uVar9].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                          super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8));
      }
      uVar9 = uVar9 + 1;
    } while ((cmComputeTargetDepends *)uVar9 != local_b8);
  }
  return bVar11;
}

Assistant:

bool cmComputeTargetDepends::ComputeFinalDepends(
  cmComputeComponentGraph const& ccg)
{
  // Get the component graph information.
  std::vector<NodeList> const& components = ccg.GetComponents();
  Graph const& cgraph = ccg.GetComponentGraph();

  // Allocate the final graph.
  this->FinalGraph.resize(0);
  this->FinalGraph.resize(this->InitialGraph.size());

  // Choose intra-component edges to linearize dependencies.
  std::vector<int> const& cmap = ccg.GetComponentMap();
  this->ComponentHead.resize(components.size());
  this->ComponentTail.resize(components.size());
  int nc = static_cast<int>(components.size());
  for (int c = 0; c < nc; ++c) {
    int head = -1;
    std::set<int> emitted;
    NodeList const& nl = components[c];
    for (NodeList::const_reverse_iterator ni = nl.rbegin(); ni != nl.rend();
         ++ni) {
      std::set<int> visited;
      if (!this->IntraComponent(cmap, c, *ni, &head, emitted, visited)) {
        // Cycle in add_dependencies within component!
        this->ComplainAboutBadComponent(ccg, c, true);
        return false;
      }
    }
    this->ComponentHead[c] = head;
  }

  // Convert inter-component edges to connect component tails to heads.
  int n = static_cast<int>(cgraph.size());
  for (int depender_component = 0; depender_component < n;
       ++depender_component) {
    int depender_component_tail = this->ComponentTail[depender_component];
    EdgeList const& nl = cgraph[depender_component];
    for (EdgeList::const_iterator ni = nl.begin(); ni != nl.end(); ++ni) {
      int dependee_component = *ni;
      int dependee_component_head = this->ComponentHead[dependee_component];
      this->FinalGraph[depender_component_tail].push_back(
        cmGraphEdge(dependee_component_head, ni->IsStrong()));
    }
  }
  return true;
}